

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Matchers::Floating::WithinRelMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,WithinRelMatcher *this)

{
  ReusableStringStream *pRVar1;
  double local_48 [3];
  undefined1 local_30 [8];
  ReusableStringStream sstr;
  WithinRelMatcher *this_local;
  
  sstr.m_oss = (ostream *)this;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_30);
  pRVar1 = ReusableStringStream::operator<<((ReusableStringStream *)local_30,(char (*) [5])0x21b196)
  ;
  pRVar1 = ReusableStringStream::operator<<(pRVar1,&this->m_target);
  pRVar1 = ReusableStringStream::operator<<(pRVar1,(char (*) [13])" are within ");
  local_48[0] = this->m_epsilon * 100.0;
  pRVar1 = ReusableStringStream::operator<<(pRVar1,local_48);
  ReusableStringStream::operator<<(pRVar1,(char (*) [16])"% of each other");
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,(ReusableStringStream *)local_30);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string WithinRelMatcher::describe() const {
        Catch::ReusableStringStream sstr;
        sstr << "and " << m_target << " are within " << m_epsilon * 100. << "% of each other";
        return sstr.str();
    }